

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O3

GVariant * media_player2_player_skeleton_get_metadata(MediaPlayer2Player *object)

{
  GType GVar1;
  long lVar2;
  GVariant *pGVar3;
  
  GVar1 = media_player2_player_skeleton_get_type();
  lVar2 = g_type_check_instance_cast(object,GVar1);
  g_mutex_lock(*(long *)(lVar2 + 0x20) + 0x20);
  pGVar3 = (GVariant *)g_value_get_variant(**(long **)(lVar2 + 0x20) + 0x60);
  g_mutex_unlock(*(long *)(lVar2 + 0x20) + 0x20);
  return pGVar3;
}

Assistant:

static GVariant *
media_player2_player_skeleton_get_metadata (MediaPlayer2Player *object)
{
  MediaPlayer2PlayerSkeleton *skeleton = MEDIA_PLAYER2_PLAYER_SKELETON (object);
  GVariant *value;
  g_mutex_lock (&skeleton->priv->lock);
  value = g_value_get_variant (&(skeleton->priv->properties[4]));
  g_mutex_unlock (&skeleton->priv->lock);
  return value;
}